

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64-decode.c
# Opt level: O0

int lws_b64_encode_string(char *in,int in_len,char *out,int out_size)

{
  int iVar1;
  int out_size_local;
  char *out_local;
  int in_len_local;
  char *in_local;
  
  iVar1 = _lws_b64_encode_string
                    ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",in,in_len,
                     out,out_size);
  return iVar1;
}

Assistant:

static int
_lws_b64_encode_string(const char *encode, const char *in, int in_len,
		       char *out, int out_size)
{
	unsigned char triple[3];
	int i, done = 0;

	while (in_len) {
		int len = 0;
		for (i = 0; i < 3; i++) {
			if (in_len) {
				triple[i] = (unsigned char)*in++;
				len++;
				in_len--;
			} else
				triple[i] = 0;
		}

		if (done + 4 >= out_size)
			return -1;

		*out++ = encode[triple[0] >> 2];
		*out++ = encode[(((triple[0] & 0x03) << 4) & 0x30) |
					     (((triple[1] & 0xf0) >> 4) & 0x0f)];
		*out++ = (len > 1 ? encode[(((triple[1] & 0x0f) << 2) & 0x3c) |
					(((triple[2] & 0xc0) >> 6) & 3)] : '=');
		*out++ = (len > 2 ? encode[triple[2] & 0x3f] : '=');

		done += 4;
	}

	if (done + 1 >= out_size)
		return -1;

	*out++ = '\0';

	return done;
}